

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastparser.cpp
# Opt level: O3

Expr * __thiscall
SQCompilation::SQParser::Expression(SQParser *this,SQExpressionContext expression_context)

{
  SQExpressionContext SVar1;
  long lVar2;
  TerExpr *pTVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  TerExpr *args;
  Expr *pEVar8;
  Chunk *pCVar9;
  Expr *args_2;
  TreeOp TVar10;
  
  uVar7 = this->_depth;
  if (500 < uVar7) {
    reportDiagnostic(this,0x1d);
    uVar7 = this->_depth;
  }
  this->_depth = uVar7 + 1;
  SVar1 = this->_expression_context;
  this->_expression_context = expression_context;
  args = (TerExpr *)LogicalNullCoalesceExp(this);
  lVar2 = this->_token;
  if (((lVar2 - 0x119U < 0x27) && ((0x7000000301U >> (lVar2 - 0x119U & 0x3f) & 1) != 0)) ||
     (lVar2 == 0x3d)) {
    Lex(this);
    pEVar8 = Expression(this,SQE_RVALUE);
    if (lVar2 < 0x122) {
      if (lVar2 == 0x3d) {
        if (expression_context - SQE_IF < 6) {
          reportDiagnostic(this,0x1e,
                           &DAT_0017df58 +
                           *(int *)(&DAT_0017df58 + (ulong)(expression_context - SQE_IF) * 4));
        }
        pCVar9 = Arena::findChunk(this->_astArena,0x30);
        TVar10 = TO_ASSIGN;
      }
      else if (lVar2 == 0x119) {
        pCVar9 = Arena::findChunk(this->_astArena,0x30);
        TVar10 = TO_NEWSLOT;
      }
      else {
        if (lVar2 != 0x121) goto LAB_001610c5;
        pCVar9 = Arena::findChunk(this->_astArena,0x30);
        TVar10 = TO_PLUSEQ;
      }
    }
    else if (lVar2 < 0x13e) {
      if (lVar2 == 0x122) {
        pCVar9 = Arena::findChunk(this->_astArena,0x30);
        TVar10 = TO_MINUSEQ;
      }
      else {
        if (lVar2 != 0x13d) goto LAB_001610c5;
        pCVar9 = Arena::findChunk(this->_astArena,0x30);
        TVar10 = TO_MULEQ;
      }
    }
    else if (lVar2 == 0x13e) {
      pCVar9 = Arena::findChunk(this->_astArena,0x30);
      TVar10 = TO_DIVEQ;
    }
    else {
      if (lVar2 != 0x13f) goto LAB_001610c5;
      pCVar9 = Arena::findChunk(this->_astArena,0x30);
      TVar10 = TO_MODEQ;
    }
    pTVar3 = (TerExpr *)pCVar9->_ptr;
    pCVar9->_ptr = (uint8_t *)&pTVar3->_c;
    (pTVar3->super_Expr).super_Node._op = TVar10;
    (pTVar3->super_Expr).super_Node._coordinates.lineStart = -1;
    (pTVar3->super_Expr).super_Node._coordinates.columnStart = -1;
    (pTVar3->super_Expr).super_Node._coordinates.lineEnd = -1;
    (pTVar3->super_Expr).super_Node._coordinates.columnEnd = -1;
    (pTVar3->super_Expr).super_Node.super_ArenaObj._vptr_ArenaObj =
         (_func_int **)&PTR__ArenaObj_001a2c10;
    pTVar3->_a = (Expr *)args;
    pTVar3->_b = pEVar8;
    iVar5 = (pEVar8->super_Node)._coordinates.lineEnd;
    iVar6 = (pEVar8->super_Node)._coordinates.columnEnd;
    iVar4 = (args->super_Expr).super_Node._coordinates.columnStart;
    (pTVar3->super_Expr).super_Node._coordinates.lineStart =
         (args->super_Expr).super_Node._coordinates.lineStart;
    (pTVar3->super_Expr).super_Node._coordinates.columnStart = iVar4;
    (pTVar3->super_Expr).super_Node._coordinates.lineEnd = iVar5;
    (pTVar3->super_Expr).super_Node._coordinates.columnEnd = iVar6;
    args = pTVar3;
  }
  else if (lVar2 == 0x3f) {
    Lex(this);
    pEVar8 = Expression(this,SQE_RVALUE);
    Expect(this,0x3a);
    args_2 = Expression(this,SQE_RVALUE);
    args = newNode<SQCompilation::TerExpr,SQCompilation::Expr*,SQCompilation::Expr*,SQCompilation::Expr*>
                     (this,(Expr *)args,pEVar8,args_2);
  }
LAB_001610c5:
  this->_expression_context = SVar1;
  this->_depth = this->_depth - 1;
  return &args->super_Expr;
}

Assistant:

Expr* SQParser::Expression(SQExpressionContext expression_context)
{
    NestingChecker nc(this);
    SQExpressionContext saved_expression_context = _expression_context;
    _expression_context = expression_context;

    Expr *expr = LogicalNullCoalesceExp();

    switch(_token)  {
    case _SC('='):
    case TK_NEWSLOT:
    case TK_MINUSEQ:
    case TK_PLUSEQ:
    case TK_MULEQ:
    case TK_DIVEQ:
    case TK_MODEQ: {
        SQInteger op = _token;
        Lex();
        Expr *e2 = Expression(SQE_RVALUE);

        switch (op) {
        case TK_NEWSLOT:
            expr = newNode<BinExpr>(TO_NEWSLOT, expr, e2);
            break;
        case _SC('='): //ASSIGN
            switch (expression_context)
            {
            case SQE_IF:
                reportDiagnostic(DiagnosticsId::DI_ASSIGN_INSIDE_FORBIDDEN, "if");
                break;
            case SQE_LOOP_CONDITION:
                reportDiagnostic(DiagnosticsId::DI_ASSIGN_INSIDE_FORBIDDEN, "loop condition");
                break;
            case SQE_SWITCH:
                reportDiagnostic(DiagnosticsId::DI_ASSIGN_INSIDE_FORBIDDEN, "switch");
                break;
            case SQE_FUNCTION_ARG:
                reportDiagnostic(DiagnosticsId::DI_ASSIGN_INSIDE_FORBIDDEN, "function argument");
                break;
            case SQE_RVALUE:
                reportDiagnostic(DiagnosticsId::DI_ASSIGN_INSIDE_FORBIDDEN, "expression");
                break;
            case SQE_ARRAY_ELEM:
                reportDiagnostic(DiagnosticsId::DI_ASSIGN_INSIDE_FORBIDDEN, "array element");
                break;
            case SQE_REGULAR:
                break;
            }
            expr = newNode<BinExpr>(TO_ASSIGN, expr, e2);
            break;
        case TK_MINUSEQ: expr = newNode<BinExpr>(TO_MINUSEQ, expr, e2); break;
        case TK_PLUSEQ: expr = newNode<BinExpr>(TO_PLUSEQ, expr, e2); break;
        case TK_MULEQ: expr = newNode<BinExpr>(TO_MULEQ, expr, e2); break;
        case TK_DIVEQ: expr = newNode<BinExpr>(TO_DIVEQ, expr, e2); break;
        case TK_MODEQ: expr = newNode<BinExpr>(TO_MODEQ, expr, e2); break;
        }
    }
    break;
    case _SC('?'): {
        Consume('?');

        Expr *ifTrue = Expression(SQE_RVALUE);

        Expect(_SC(':'));

        Expr *ifFalse = Expression(SQE_RVALUE);

        expr = newNode<TerExpr>(expr, ifTrue, ifFalse);
    }
    break;
    }

    _expression_context = saved_expression_context;
    return expr;
}